

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

double __thiscall CDT::predict(CDT *this,vector<double,_std::allocator<double>_> *inputs)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *inputs_local;
  CDT *this_local;
  
  dVar1 = feed_forward(this,inputs);
  return dVar1;
}

Assistant:

double CDT::predict(const std::vector<double>& inputs) const{
    // std::cout<<"Prediction for (";
    // for(unsigned i=0;i<inputs.size();++i){
    //     std::cout<<inputs[i]<<" ";
    // }
    // std::cout<<"): ";

    return feed_forward(inputs);
}